

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStateReset.cpp
# Opt level: O1

void glu::resetState(RenderContext *renderCtx,ContextInfo *ctxInfo)

{
  uint uVar1;
  InternalError *this;
  string local_40;
  
  uVar1 = (*renderCtx->_vptr_RenderContext[2])();
  if ((uVar1 & 0x300) == 0) {
    resetStateES(renderCtx,ctxInfo);
    return;
  }
  uVar1 = (*renderCtx->_vptr_RenderContext[2])(renderCtx);
  if ((uVar1 & 0x300) == 0x100) {
    resetStateGLCore(renderCtx,ctxInfo);
    return;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"State reset requested for unsupported context type","");
  tcu::InternalError::InternalError(this,&local_40);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void resetState (const RenderContext& renderCtx, const ContextInfo& ctxInfo)
{
	if (isContextTypeES(renderCtx.getType()))
		resetStateES(renderCtx, ctxInfo);
	else if (isContextTypeGLCore(renderCtx.getType()))
		resetStateGLCore(renderCtx, ctxInfo);
	else
		throw tcu::InternalError("State reset requested for unsupported context type");
}